

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# terminal.c
# Opt level: O0

void terminal_deletechars(EditLine *el,wchar_t num)

{
  char *cap;
  wchar_t local_14;
  wchar_t num_local;
  EditLine *el_local;
  
  if (((L'\0' < num) && (((el->el_terminal).t_flags & 2U) != 0)) &&
     (num <= (el->el_terminal).t_size.h)) {
    if ((((el->el_terminal).t_str[0x1e] == (char *)0x0) || (*(el->el_terminal).t_str[0x1e] == '\0'))
       || ((num < L'\x02' &&
           (((el->el_terminal).t_str[6] != (char *)0x0 && (*(el->el_terminal).t_str[6] != '\0'))))))
    {
      if (((el->el_terminal).t_str[8] != (char *)0x0) && (*(el->el_terminal).t_str[8] != '\0')) {
        terminal_tputs(el,(el->el_terminal).t_str[8],L'\x01');
      }
      if (((el->el_terminal).t_str[6] != (char *)0x0) &&
         (local_14 = num, *(el->el_terminal).t_str[6] != '\0')) {
        while (local_14 != L'\0') {
          terminal_tputs(el,(el->el_terminal).t_str[6],L'\x01');
          local_14 = local_14 + L'\xffffffff';
        }
      }
      if (((el->el_terminal).t_str[9] != (char *)0x0) && (*(el->el_terminal).t_str[9] != '\0')) {
        terminal_tputs(el,(el->el_terminal).t_str[9],L'\x01');
      }
    }
    else {
      cap = (char *)tgoto((el->el_terminal).t_str[0x1e],num,num);
      terminal_tputs(el,cap,num);
    }
  }
  return;
}

Assistant:

libedit_private void
terminal_deletechars(EditLine *el, int num)
{
	if (num <= 0)
		return;

	if (!EL_CAN_DELETE) {
#ifdef DEBUG_EDIT
		(void) fprintf(el->el_errfile, "   ERROR: cannot delete   \n");
#endif /* DEBUG_EDIT */
		return;
	}
	if (num > el->el_terminal.t_size.h) {
#ifdef DEBUG_SCREEN
		(void) fprintf(el->el_errfile,
		    "%s: num is ridiculous: %d\r\n", __func__, num);
#endif /* DEBUG_SCREEN */
		return;
	}
	if (GoodStr(T_DC))	/* if I have multiple delete */
		if ((num > 1) || !GoodStr(T_dc)) {	/* if dc would be more
							 * expen. */
			terminal_tputs(el, tgoto(Str(T_DC), num, num), num);
			return;
		}
	if (GoodStr(T_dm))	/* if I have delete mode */
		terminal_tputs(el, Str(T_dm), 1);

	if (GoodStr(T_dc))	/* else do one at a time */
		while (num--)
			terminal_tputs(el, Str(T_dc), 1);

	if (GoodStr(T_ed))	/* if I have delete mode */
		terminal_tputs(el, Str(T_ed), 1);
}